

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O0

ArrayBufferContentForDelayedFreeBase * __thiscall
Js::ProjectionArrayBuffer::CopyBufferContentForDelayedFree
          (ProjectionArrayBuffer *this,RefCountedBuffer *content,uint32 bufferLength)

{
  uint32 len;
  RefCountedBuffer *content_00;
  HeapAllocator *alloc;
  ArrayBufferContentForDelayedFree<void_(*)(void_*)> *this_00;
  Recycler *r;
  TrackAllocData local_48;
  uint32 local_1c;
  RefCountedBuffer *pRStack_18;
  uint32 bufferLength_local;
  RefCountedBuffer *content_local;
  ProjectionArrayBuffer *this_local;
  
  local_1c = bufferLength;
  pRStack_18 = content;
  content_local = (RefCountedBuffer *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&ArrayBufferContentForDelayedFree<void(*)(void*)>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
             ,0x4d8);
  alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_48);
  this_00 = (ArrayBufferContentForDelayedFree<void_(*)(void_*)> *)
            new<Memory::HeapAllocator>(0x30,alloc,0x350bd0);
  content_00 = pRStack_18;
  len = local_1c;
  r = RecyclableObject::GetRecycler((RecyclableObject *)this);
  ArrayBufferContentForDelayedFree<void_(*)(void_*)>::ArrayBufferContentForDelayedFree
            (this_00,content_00,len,r,CoTaskMemFree);
  return &this_00->super_ArrayBufferContentForDelayedFreeBase;
}

Assistant:

ArrayBufferContentForDelayedFreeBase* ProjectionArrayBuffer::CopyBufferContentForDelayedFree(RefCountedBuffer * content, DECLSPEC_GUARD_OVERFLOW uint32 bufferLength)
    {
        // This heap object will be deleted when the Recycler::DelayedFreeArrayBuffer determines to remove this item
        return HeapNew(ArrayBufferContentForDelayedFree<FreeFn>, content, bufferLength, GetRecycler(), CoTaskMemFree);
    }